

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool MatchPayToPubkey(CScript *script,valtype *pubkey)

{
  size_type sVar1;
  uchar *puVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff18;
  size_type in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 uVar4;
  allocator_type *in_stack_ffffffffffffff40;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff68;
  bool local_72;
  allocator_type local_39;
  uchar *local_38;
  uchar *local_30;
  uchar *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (sVar1 == 0x43) {
    puVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        in_stack_ffffffffffffff24);
    if (*puVar2 == 'A') {
      puVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::back
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (*puVar2 == 0xac) {
        local_28 = (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                                      );
        prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                  ((const_iterator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
        local_38 = (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                                      );
        local_30 = (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::
                            operator+((const_iterator *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                      in_stack_ffffffffffffff1c);
        cVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                          ((const_iterator *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
        __a = &local_39;
        std::allocator<unsigned_char>::allocator
                  ((allocator<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                  (in_stack_ffffffffffffff48,cVar3,in_stack_ffffffffffffff60,__a);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_72 = CPubKey::ValidSize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
        ;
        goto LAB_01aa8ec0;
      }
    }
  }
  sVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (sVar1 == 0x23) {
    puVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        in_stack_ffffffffffffff24);
    if (*puVar2 == '!') {
      puVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::back
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (*puVar2 == 0xac) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        uVar4 = 1;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                  ((const_iterator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                  ((const_iterator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
        cVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                          ((const_iterator *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
        std::allocator<unsigned_char>::allocator
                  ((allocator<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)cVar3.ptr,
                   in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff40);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(uVar4,in_stack_ffffffffffffff28),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(uVar4,in_stack_ffffffffffffff28));
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_72 = CPubKey::ValidSize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT44(uVar4,in_stack_ffffffffffffff28));
        goto LAB_01aa8ec0;
      }
    }
  }
  local_72 = false;
LAB_01aa8ec0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_72;
  }
  __stack_chk_fail();
}

Assistant:

static bool MatchPayToPubkey(const CScript& script, valtype& pubkey)
{
    if (script.size() == CPubKey::SIZE + 2 && script[0] == CPubKey::SIZE && script.back() == OP_CHECKSIG) {
        pubkey = valtype(script.begin() + 1, script.begin() + CPubKey::SIZE + 1);
        return CPubKey::ValidSize(pubkey);
    }
    if (script.size() == CPubKey::COMPRESSED_SIZE + 2 && script[0] == CPubKey::COMPRESSED_SIZE && script.back() == OP_CHECKSIG) {
        pubkey = valtype(script.begin() + 1, script.begin() + CPubKey::COMPRESSED_SIZE + 1);
        return CPubKey::ValidSize(pubkey);
    }
    return false;
}